

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRST.cxx
# Opt level: O3

string * __thiscall
cmRST::ReplaceSubstitutions(string *__return_storage_ptr__,cmRST *this,string *line)

{
  char *pcVar1;
  bool bVar2;
  iterator iVar3;
  char *pcVar4;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar5;
  string substitute;
  key_type local_b0;
  string *local_90;
  string local_88;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_68;
  char *local_60;
  cmRST *local_58;
  _Base_ptr local_50;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_48;
  RegularExpression *local_40;
  char *local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_40 = &this->Substitution;
  local_48 = &this->Replace;
  local_50 = &(this->Replace)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_68 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&this->Replaced;
  pcVar4 = (char *)0x0;
  local_90 = line;
  local_58 = this;
  while( true ) {
    bVar2 = cmsys::RegularExpression::find
                      (local_40,pcVar4 + (long)(local_90->_M_dataplus)._M_p,&local_40->regmatch);
    if (!bVar2) break;
    local_60 = (this->Substitution).regmatch.searchstring;
    local_38 = (this->Substitution).regmatch.endp[2];
    pcVar1 = (this->Substitution).regmatch.startp[3];
    if (pcVar1 == (char *)0x0) {
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      local_b0._M_string_length = 0;
      local_b0.field_2._M_local_buf[0] = '\0';
    }
    else {
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,pcVar1,(this->Substitution).regmatch.endp[3]);
    }
    iVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&local_48->_M_t,&local_b0);
    if (iVar3._M_node != local_50) {
      pVar5 = std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>(local_68,&local_b0);
      if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        ReplaceSubstitutions(&local_88,this,(string *)(iVar3._M_node + 2));
        std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::erase_abi_cxx11_(local_68,(_Base_ptr)pVar5.first._M_node);
        this = local_58;
      }
    }
    std::__cxx11::string::substr((ulong)&local_88,(ulong)local_90);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_88._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_b0._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,
                      CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                               local_b0.field_2._M_local_buf[0]) + 1);
    }
    pcVar4 = local_38 + ((long)pcVar4 - (long)local_60);
  }
  std::__cxx11::string::substr((ulong)&local_b0,(ulong)local_90);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_b0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,
                    CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                             local_b0.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmRST::ReplaceSubstitutions(std::string const& line)
{
  std::string out;
  std::string::size_type pos = 0;
  while (this->Substitution.find(line.c_str() + pos)) {
    std::string::size_type start = this->Substitution.start(2);
    std::string::size_type end = this->Substitution.end(2);
    std::string substitute = this->Substitution.match(3);
    std::map<std::string, std::string>::iterator replace =
      this->Replace.find(substitute);
    if (replace != this->Replace.end()) {
      std::pair<std::set<std::string>::iterator, bool> replaced =
        this->Replaced.insert(substitute);
      if (replaced.second) {
        substitute = this->ReplaceSubstitutions(replace->second);
        this->Replaced.erase(replaced.first);
      }
    }
    out += line.substr(pos, start);
    out += substitute;
    pos += end;
  }
  out += line.substr(pos);
  return out;
}